

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_ObjPrint(FILE *pFile,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,"Object %5d : ",(ulong)(uint)pObj->Id);
  switch(*(uint *)&pObj->field_0x14 & 0xf) {
  case 0:
    fprintf((FILE *)pFile,"NONE   ");
    break;
  case 1:
    fprintf((FILE *)pFile,"Const1 ");
    break;
  case 2:
    fprintf((FILE *)pFile,"PI     ");
    break;
  case 3:
    fprintf((FILE *)pFile,"PO     ");
    break;
  case 4:
    fprintf((FILE *)pFile,"BI     ");
    break;
  case 5:
    fprintf((FILE *)pFile,"BO     ");
    break;
  case 6:
    fprintf((FILE *)pFile,"Net    ");
    break;
  case 7:
    fprintf((FILE *)pFile,"Node   ");
    break;
  case 8:
    fprintf((FILE *)pFile,"Latch  ");
    break;
  case 9:
    fprintf((FILE *)pFile,"Whitebox");
    break;
  case 10:
    fprintf((FILE *)pFile,"Blackbox");
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPrint.c"
                  ,0x641,"void Abc_ObjPrint(FILE *, Abc_Obj_t *)");
  }
  fprintf((FILE *)pFile," Fanins ( ");
  for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_ObjFanin(pObj,local_24);
    fprintf((FILE *)pFile,"%d ",(ulong)(uint)pAVar2->Id);
  }
  fprintf((FILE *)pFile,") ");
  iVar1 = Abc_ObjIsNode(pObj);
  if ((iVar1 == 0) || (iVar1 = Abc_NtkIsSopLogic(pObj->pNtk), iVar1 == 0)) {
    iVar1 = Abc_ObjIsNode(pObj);
    if ((iVar1 == 0) || (iVar1 = Abc_NtkIsMappedLogic(pObj->pNtk), iVar1 == 0)) {
      fprintf((FILE *)pFile,"\n");
    }
    else {
      pcVar3 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
      fprintf((FILE *)pFile," %s\n",pcVar3);
    }
  }
  else {
    fprintf((FILE *)pFile," %s",(pObj->field_5).pData);
  }
  return;
}

Assistant:

void Abc_ObjPrint( FILE * pFile, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    fprintf( pFile, "Object %5d : ", pObj->Id );
    switch ( pObj->Type )
    {
        case ABC_OBJ_NONE:
            fprintf( pFile, "NONE   " );
            break;
        case ABC_OBJ_CONST1:
            fprintf( pFile, "Const1 " );
            break;
        case ABC_OBJ_PI:
            fprintf( pFile, "PI     " );
            break;
        case ABC_OBJ_PO:
            fprintf( pFile, "PO     " );
            break;
        case ABC_OBJ_BI:
            fprintf( pFile, "BI     " );
            break;
        case ABC_OBJ_BO:
            fprintf( pFile, "BO     " );
            break;
        case ABC_OBJ_NET:
            fprintf( pFile, "Net    " );
            break;
        case ABC_OBJ_NODE:
            fprintf( pFile, "Node   " );
            break;
        case ABC_OBJ_LATCH:
            fprintf( pFile, "Latch  " );
            break;
        case ABC_OBJ_WHITEBOX:
            fprintf( pFile, "Whitebox" );
            break;
        case ABC_OBJ_BLACKBOX:
            fprintf( pFile, "Blackbox" );
            break;
        default:
            assert(0);
            break;
    }
    // print the fanins
    fprintf( pFile, " Fanins ( " );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        fprintf( pFile, "%d ", pFanin->Id );
    fprintf( pFile, ") " );
/*
    fprintf( pFile, " Fanouts ( " );
    Abc_ObjForEachFanout( pObj, pFanin, i )
        fprintf( pFile, "%d(%c) ", pFanin->Id, Abc_NodeIsTravIdCurrent(pFanin)? '+' : '-' );
    fprintf( pFile, ") " );
*/
    // print the logic function
    if ( Abc_ObjIsNode(pObj) && Abc_NtkIsSopLogic(pObj->pNtk) )
        fprintf( pFile, " %s", (char*)pObj->pData );
    else if ( Abc_ObjIsNode(pObj) && Abc_NtkIsMappedLogic(pObj->pNtk) )
        fprintf( pFile, " %s\n", Mio_GateReadName((Mio_Gate_t *)pObj->pData) );
    else
        fprintf( pFile, "\n" );
}